

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O3

void baryonyx::info<std::__cxx11::string>
               (context *ctx,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg1)

{
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  char *local_20;
  pointer local_18;
  size_type sStack_10;
  
  if (5 < (int)ctx->log_priority) {
    local_18 = (arg1->_M_dataplus)._M_p;
    sStack_10 = arg1->_M_string_length;
    args.field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_20;
    args.desc_ = (unsigned_long_long)&local_18;
    local_20 = fmt;
    ::fmt::v7::vprint<char_const*,char>
              (_stdout,(FILE *)(context::message_style + 0x78),(text_style *)&local_20,(char **)0xd,
               args);
  }
  return;
}

Assistant:

inline bool
is_loggable(context::message_type current_level, int level) noexcept
{
    return static_cast<int>(current_level) >= level;
}